

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tickcounter_linux.c
# Opt level: O2

TICK_COUNTER_HANDLE tickcounter_create(void)

{
  TICK_COUNTER_HANDLE __ptr;
  int64_t iVar1;
  LOGGER_LOG p_Var2;
  
  __ptr = (TICK_COUNTER_HANDLE)malloc(0x10);
  if (__ptr != (TICK_COUNTER_HANDLE)0x0) {
    set_time_basis();
    iVar1 = get_time_ms();
    __ptr->init_time_value = iVar1;
    if (iVar1 != -1) {
      __ptr->current_ms = 0;
      return __ptr;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tickcounter_linux.c"
                ,"tickcounter_create",0x1d,1,"tickcounter failed: time return INVALID_TIME.");
    }
    free(__ptr);
  }
  return (TICK_COUNTER_HANDLE)0x0;
}

Assistant:

TICK_COUNTER_HANDLE tickcounter_create(void)
{
    TICK_COUNTER_INSTANCE* result = (TICK_COUNTER_INSTANCE*)malloc(sizeof(TICK_COUNTER_INSTANCE));
    if (result != NULL)
    {
        set_time_basis();

        result->init_time_value = get_time_ms();
        if (result->init_time_value == INVALID_TIME_VALUE)
        {
            LogError("tickcounter failed: time return INVALID_TIME.");
            free(result);
            result = NULL;
        }
        else
        {
            result->current_ms = 0;
        }
    }
    return result;
}